

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O0

uint q_PSK_client_callback
               (SSL *ssl,char *hint,char *identity,uint max_identity_len,uchar *psk,uint max_psk_len
               )

{
  void *pvVar1;
  uchar *unaff_retaddr;
  DtlsState *dtls;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000020;
  SSL *in_stack_ffffffffffffffb8;
  uint in_stack_fffffffffffffffc;
  uint uVar2;
  
  pvVar1 = q_SSL_get_ex_data(in_stack_ffffffffffffffb8,0);
  if (pvVar1 == (void *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = QDtlsPrivateOpenSSL::pskClientCallback
                      ((QDtlsPrivateOpenSSL *)CONCAT44(max_identity_len,in_stack_00000020),
                       (char *)psk,(char *)CONCAT44(max_psk_len,in_stack_00000010),dtls._4_4_,
                       unaff_retaddr,in_stack_fffffffffffffffc);
  }
  return uVar2;
}

Assistant:

unsigned q_PSK_client_callback(SSL *ssl, const char *hint, char *identity,
                                          unsigned max_identity_len, unsigned char *psk,
                                          unsigned max_psk_len)
{
    auto *dtls = static_cast<dtlsopenssl::DtlsState *>(q_SSL_get_ex_data(ssl,
                                                       QTlsBackendOpenSSL::s_indexForSSLExtraData));
    if (!dtls)
        return 0;

    Q_ASSERT(dtls->dtlsPrivate);
    return dtls->dtlsPrivate->pskClientCallback(hint, identity, max_identity_len, psk, max_psk_len);
}